

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplatformprintdevice.cpp
# Opt level: O1

QPlatformPrintDevice * __thiscall
QPlatformPrintDevice::supportedPageSize(QPlatformPrintDevice *this,PageSizeId pageSizeId)

{
  PageSizeId PVar1;
  PageSizeId in_EDX;
  undefined4 in_register_00000034;
  QPageSize *pageSize;
  long lVar2;
  QPageSize *pQVar3;
  long in_FS_OFFSET;
  bool bVar4;
  QPageSize local_40 [8];
  long local_38;
  
  pageSize = (QPageSize *)CONCAT44(in_register_00000034,pageSizeId);
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (pageSize[0x6b] == (QPageSize)0x0) {
    (**(code **)(*(long *)pageSize + 0x130))(pageSize);
  }
  lVar2 = *(long *)(pageSize + 0x80);
  bVar4 = lVar2 == 0;
  if (!bVar4) {
    pQVar3 = *(QPageSize **)(pageSize + 0x78);
    PVar1 = QPageSize::id();
    if (PVar1 != in_EDX) {
      lVar2 = lVar2 * 8;
      do {
        lVar2 = lVar2 + -8;
        bVar4 = lVar2 == 0;
        if (bVar4) goto LAB_0012c8b1;
        pQVar3 = pQVar3 + 8;
        PVar1 = QPageSize::id();
      } while (PVar1 != in_EDX);
    }
    QPageSize::QPageSize((QPageSize *)this,pQVar3);
    if (!bVar4) goto LAB_0012c8d6;
  }
LAB_0012c8b1:
  QPageSize::QPageSize(local_40,in_EDX);
  supportedPageSizeMatch(this,pageSize);
  QPageSize::~QPageSize(local_40);
LAB_0012c8d6:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

QPageSize QPlatformPrintDevice::supportedPageSize(QPageSize::PageSizeId pageSizeId) const
{
    if (!m_havePageSizes)
        loadPageSizes();

    for (const QPageSize &ps : std::as_const(m_pageSizes)) {
        if (ps.id() == pageSizeId)
            return ps;
    }

    // If no supported page size found, try use a custom size instead if supported
    return supportedPageSizeMatch(QPageSize(pageSizeId));
}